

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_order_executed *m)

{
  order_book *this_00;
  bool bVar1;
  trade_sign sign;
  string *symbol;
  pointer ppVar2;
  uint64_t timestamp;
  order_book *ob_00;
  long in_RSI;
  nordic_itch_handler *in_RDI;
  trade t;
  execution result;
  order_book *ob;
  uint64_t quantity;
  iterator it;
  uint64_t order_id;
  undefined4 in_stack_fffffffffffffed8;
  event_mask in_stack_fffffffffffffedc;
  order_book *this_01;
  side_type s;
  undefined8 in_stack_ffffffffffffff20;
  trade local_70;
  uint64_t in_stack_ffffffffffffffb0;
  uint64_t in_stack_ffffffffffffffb8;
  order_book *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_helix::order_book_&>,_false> local_20;
  uint64_t local_18;
  long local_10;
  
  s = (side_type)((ulong)in_stack_ffffffffffffff20 >> 0x18);
  local_10 = in_RSI;
  local_18 = itch_uatoi((char *)(in_RSI + 1),9);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::find((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
               *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(key_type *)0x14f5b8)
  ;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
       ::end((unordered_map<unsigned_long,_helix::order_book_&,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_helix::order_book_&>_>_>
              *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  bVar1 = std::__detail::operator!=(&local_20,&local_28);
  if (bVar1) {
    symbol = (string *)itch_uatoi((char *)(local_10 + 10),9);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_unsigned_long,_helix::order_book_&>,_false,_false>
                         *)0x14f61f);
    this_00 = ppVar2->second;
    order_book::execute(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0);
    this_01 = this_00;
    timestamp = nordic_itch_handler::timestamp(in_RDI);
    order_book::set_timestamp(this_01,timestamp);
    ob_00 = (order_book *)nordic_itch_handler::timestamp(in_RDI);
    sign = itch_trade_sign(s);
    trade::trade(&local_70,(uint64_t)ob_00,in_stack_ffffffffffffffb0,(uint64_t)symbol,sign);
    order_book::symbol_abi_cxx11_(this_00);
    nordic_itch_handler::timestamp(in_RDI);
    sweep_event(in_RDI,(execution *)&stack0xffffffffffffffb0);
    make_event(symbol,in_stack_ffffffffffffffb0,ob_00,(trade *)this_01,in_stack_fffffffffffffedc);
    std::function<void_(const_helix::event_&)>::operator()
              ((function<void_(const_helix::event_&)> *)this_01,
               (event *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    event::~event((event *)0x14f75f);
  }
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_order_executed* m)
{
   uint64_t order_id = itch_uatoi(m->OrderReferenceNumber, sizeof(m->OrderReferenceNumber));
   auto it = order_id_map.find(order_id);
   if (it != order_id_map.end()) {
       uint64_t quantity = itch_uatoi(m->ExecutedQuantity, sizeof(m->ExecutedQuantity));
       auto& ob = it->second;
       auto result = ob.execute(order_id, quantity);
       ob.set_timestamp(timestamp());
       trade t{timestamp(), result.price, quantity, itch_trade_sign(result.side)};
        _process_event(make_event(ob.symbol(), timestamp(), &ob, &t, sweep_event(result)));
   }
}